

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O3

Card ** cards_createDeck(uchar decksCount)

{
  Card **ppCVar1;
  char *pcVar2;
  char cVar3;
  undefined7 in_register_00000039;
  Card **ppCVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = CONCAT71(in_register_00000039,decksCount) & 0xffffffff;
  ppCVar1 = (Card **)malloc(uVar6 * 0x1a0);
  if ((int)CONCAT71(in_register_00000039,decksCount) != 0) {
    uVar7 = 0;
    ppCVar4 = ppCVar1;
    do {
      lVar5 = 0x18;
      cVar3 = '\x01';
      do {
        pcVar2 = (char *)malloc(4);
        *pcVar2 = cVar3;
        pcVar2[1] = '\0';
        pcVar2[2] = '\x01';
        pcVar2[3] = '\x01';
        *(char **)((long)ppCVar4 + lVar5 + -0x18) = pcVar2;
        pcVar2 = (char *)malloc(4);
        *pcVar2 = cVar3;
        pcVar2[1] = '\x01';
        pcVar2[2] = '\0';
        pcVar2[3] = '\x01';
        *(char **)((long)ppCVar4 + lVar5 + -0x10) = pcVar2;
        pcVar2 = (char *)malloc(4);
        *pcVar2 = cVar3;
        pcVar2[1] = '\x02';
        pcVar2[2] = '\0';
        pcVar2[3] = '\x01';
        *(char **)((long)ppCVar4 + lVar5 + -8) = pcVar2;
        pcVar2 = (char *)malloc(4);
        *pcVar2 = cVar3;
        *(char **)((long)ppCVar4 + lVar5) = pcVar2;
        lVar5 = lVar5 + 0x20;
        cVar3 = cVar3 + '\x01';
        pcVar2[1] = '\x03';
        pcVar2[2] = '\x01';
        pcVar2[3] = '\x01';
      } while (lVar5 != 0x1b8);
      uVar7 = uVar7 + 1;
      ppCVar4 = ppCVar4 + 0x34;
    } while (uVar7 != uVar6);
  }
  return ppCVar1;
}

Assistant:

Card ** cards_createDeck(unsigned char decksCount)
{
	unsigned char i, d;
	Card ** cards = (Card **)malloc(sizeof(Card *)*(52*decksCount));

	for(d=0;d<decksCount;d++)
	{
		for(i=1;i<=13;i++)
		{
			cards[((i-1)*4)+(d*52)] = card_create(i, CLUB, true);
			cards[((i-1)*4)+1+(d*52)] = card_create(i, DIAMOND, true);
			cards[((i-1)*4)+2+(d*52)] = card_create(i, HEART, true);
			cards[((i-1)*4)+3+(d*52)] = card_create(i, SPADE, true);
		}
	}

	return cards;
}